

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

CloudManager * Cloud_Init(int nVars,int nBits)

{
  CloudManager *dd;
  CloudNode *pCVar1;
  CloudNode **ppCVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  timespec ts;
  timespec local_40;
  
  if (100000 < nVars) {
    __assert_fail("nVars <= 100000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x4c,"CloudManager *Cloud_Init(int, int)");
  }
  if (nBits < 0x20) {
    iVar6 = 0x17;
    if (nBits != 0) {
      iVar6 = nBits;
    }
    dd = (CloudManager *)calloc(1,0x130);
    dd->nMemUsed = 0x130;
    dd->nVars = nVars;
    dd->bitsNode = iVar6;
    dd->bitsCache[0] = iVar6 + -2;
    dd->bitsCache[1] = iVar6 + -8;
    dd->bitsCache[2] = iVar6 + -8;
    dd->bitsCache[3] = iVar6 + -8;
    dd->shiftUnique = 0x1f - iVar6;
    dd->shiftCache[0] = 0x22 - iVar6;
    dd->shiftCache[1] = 0x28 - iVar6;
    dd->shiftCache[2] = 0x28 - iVar6;
    dd->shiftCache[3] = 0x28 - iVar6;
    bVar3 = (byte)iVar6 + 1;
    iVar4 = 1 << (bVar3 & 0x1f);
    dd->nNodesAlloc = iVar4;
    dd->nNodesLimit = 1 << ((byte)iVar6 & 0x1f);
    clock_gettime(3,&local_40);
    pCVar1 = (CloudNode *)calloc((long)iVar4,0x18);
    dd->tUnique = pCVar1;
    iVar6 = dd->nMemUsed;
    clock_gettime(3,&local_40);
    dd->nSignCur = 1;
    pCVar1->s = 1;
    pCVar1->v = 0xfffffff;
    pCVar1->e = (CloudNode *)0x0;
    pCVar1->t = (CloudNode *)0x0;
    dd->one = pCVar1;
    dd->zero = (CloudNode *)((ulong)pCVar1 ^ 1);
    dd->nNodesCur = 1;
    dd->pNodeStart = pCVar1 + 1;
    dd->pNodeEnd = pCVar1 + iVar4;
    ppCVar2 = (CloudNode **)malloc((long)nVars << 3);
    dd->vars = ppCVar2;
    dd->nMemUsed = (0x18 << (bVar3 & 0x1f)) + iVar6 + nVars * 8;
    if (0 < nVars) {
      lVar5 = 0;
      do {
        pCVar1 = cloudMakeNode(dd,(CloudVar)lVar5,dd->one,dd->zero);
        dd->vars[lVar5] = pCVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < dd->nVars);
    }
    return dd;
  }
  __assert_fail("nBits < 32",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,0x4d,"CloudManager *Cloud_Init(int, int)");
}

Assistant:

CloudManager * Cloud_Init( int nVars, int nBits )
{
	CloudManager * dd;
	int i;
	abctime clk1, clk2;

	assert( nVars <= 100000 );
	assert( nBits < 32 );

	// assign the defaults
	if ( nBits == 0 )
		nBits = CLOUD_NODE_BITS;

	// start the manager
	dd = ABC_CALLOC( CloudManager, 1 );
	dd->nMemUsed          += sizeof(CloudManager);

	// variables
	dd->nVars             = nVars;              // the number of variables allocated
	// bits
	dd->bitsNode          = nBits;              // the number of bits used for the node
	for ( i = 0; i < CacheOperNum; i++ )
		dd->bitsCache[i]  = nBits - CacheLogRatioDefault[i];
	// shifts
	dd->shiftUnique       = 8*sizeof(unsigned) - (nBits + 1); // gets node index in the hash table
	for ( i = 0; i < CacheOperNum; i++ )
		dd->shiftCache[i] = 8*sizeof(unsigned) - dd->bitsCache[i];
	// nodes
	dd->nNodesAlloc       = (1 << (nBits + 1)); // 2 ^ (nBits + 1)
	dd->nNodesLimit       = (1 << nBits);       // 2 ^  nBits

	// unique table
clk1 = Abc_Clock();
	dd->tUnique           = ABC_CALLOC( CloudNode, dd->nNodesAlloc );
	dd->nMemUsed         += sizeof(CloudNode) * dd->nNodesAlloc;
clk2 = Abc_Clock();
//ABC_PRT( "calloc() time", clk2 - clk1 ); 

	// set up the constant node (the only node that is not in the hash table)
	dd->nSignCur          = 1;
	dd->tUnique[0].s      = dd->nSignCur;
	dd->tUnique[0].v      = CLOUD_CONST_INDEX;
	dd->tUnique[0].e      = NULL;
	dd->tUnique[0].t      = NULL;
	dd->one               = dd->tUnique;
	dd->zero              = Cloud_Not(dd->one);
	dd->nNodesCur         = 1;

	// special nodes
	dd->pNodeStart        = dd->tUnique + 1;
	dd->pNodeEnd          = dd->tUnique + dd->nNodesAlloc;

	// set up the elementary variables
	dd->vars              = ABC_ALLOC( CloudNode *, dd->nVars );
	dd->nMemUsed         += sizeof(CloudNode *) * dd->nVars;
	for ( i = 0; i < dd->nVars; i++ )
		dd->vars[i]   = cloudMakeNode( dd, i, dd->one, dd->zero );

	return dd;
}